

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

void __thiscall helics::apps::Tracer::runTo(Tracer *this,Time runToTime)

{
  bool bVar1;
  ostream *this_00;
  ostream *t;
  baseType in_RSI;
  long *in_RDI;
  double dVar2;
  iteration_time iVar3;
  iteration_time ItRes;
  Time grantedTime;
  int iteration;
  Time nextPrintTime;
  Modes state;
  int in_stack_000003ec;
  Tracer *in_stack_000003f0;
  Time in_stack_000003f8;
  double in_stack_ffffffffffffff38;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffff40;
  TimeRepresentation<count_time<9,_long>_> local_98;
  baseType local_90;
  baseType local_88;
  baseType local_80;
  baseType local_78;
  baseType local_70;
  IterationResult local_68;
  IterationRequest in_stack_ffffffffffffffa7;
  Federate *in_stack_ffffffffffffffa8;
  IterationResult in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc1;
  IterationRequest in_stack_ffffffffffffffc7;
  Time in_stack_ffffffffffffffc8;
  TimeRepresentation<count_time<9,_long>_> local_28 [2];
  Modes local_11;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = in_RSI;
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4163dd);
  local_11 = Federate::getCurrentMode((Federate *)0x4163ec);
  if (local_11 == STARTUP) {
    (**(code **)(*in_RDI + 0x10))();
    local_11 = INITIALIZING;
  }
  if (local_11 == INITIALIZING) {
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x416428);
    Federate::enterExecutingMode
              ((Federate *)in_stack_ffffffffffffffc8.internalTimeCode,in_stack_ffffffffffffffc7);
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    captureForCurrentTime(in_stack_000003f0,in_stack_000003f8,in_stack_000003ec);
  }
  local_28[0].internalTimeCode = 10000000000;
  while( true ) {
    if ((*(byte *)((long)in_RDI + 0xa1) & 1) == 0) {
      CLI::std::
      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x416589);
      local_88 = local_8.internalTimeCode;
      local_90 = (baseType)
                 Federate::requestTime
                           ((Federate *)
                            CONCAT17(in_stack_ffffffffffffffc7,
                                     CONCAT61(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0)),
                            in_stack_ffffffffffffffc8);
      local_80 = local_90;
      in_stack_ffffffffffffffc8 = (Time)local_90;
      captureForCurrentTime(in_stack_000003f0,in_stack_000003f8,in_stack_000003ec);
    }
    else {
      CLI::std::
      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x416499);
      iVar3 = Federate::requestTimeIterative
                        (in_stack_ffffffffffffffa8,(Time)local_8.internalTimeCode,
                         in_stack_ffffffffffffffa7);
      local_78 = (baseType)iVar3.grantedTime.internalTimeCode;
      local_68 = iVar3.state;
      local_70 = local_78;
      in_stack_ffffffffffffffc0 = local_68;
      in_stack_ffffffffffffffc8.internalTimeCode = local_78;
      captureForCurrentTime(in_stack_000003f0,in_stack_000003f8,in_stack_000003ec);
    }
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffc8,&local_8
                      );
    if (bVar1) break;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffc8,local_28
                      );
    if (bVar1) {
      this_00 = std::operator<<((ostream *)&std::cout,"processed for time ");
      dVar2 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x41664f);
      t = (ostream *)std::ostream::operator<<(this_00,dVar2);
      std::operator<<(t,"\n");
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)this_00,(double)t);
      TimeRepresentation<count_time<9,_long>_>::operator+=(local_28,&local_98);
    }
  }
  return;
}

Assistant:

void Tracer::runTo(Time runToTime)
{
    auto state = fed->getCurrentMode();
    if (state == Federate::Modes::STARTUP) {
        initialize();
        state = Federate::Modes::INITIALIZING;
    }

    if (state == Federate::Modes::INITIALIZING) {
        fed->enterExecutingMode();
        captureForCurrentTime(0.0);
    }

    Time nextPrintTime = 10.0;
    try {
        int iteration = 0;
        while (true) {
            helics::Time grantedTime;

            if (allow_iteration) {
                auto ItRes =
                    fed->requestTimeIterative(runToTime, IterationRequest::ITERATE_IF_NEEDED);
                if (ItRes.state == IterationResult::NEXT_STEP) {
                    iteration = 0;
                }
                grantedTime = ItRes.grantedTime;
                captureForCurrentTime(grantedTime, iteration);
                ++iteration;
            } else {
                grantedTime = fed->requestTime(runToTime);
                captureForCurrentTime(grantedTime);
            }
            if (grantedTime >= runToTime) {
                break;
            }
            if (grantedTime >= nextPrintTime) {
                std::cout << "processed for time " << static_cast<double>(grantedTime) << "\n";
                nextPrintTime += 10.0;
            }
        }
    }
    catch (...) {
    }
}